

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O2

string * deqp::gles2::Performance::anon_unknown_1::FunctionCase::incrementExpr
                   (string *__return_storage_ptr__,string *baseExpr,DataType type,bool divide)

{
  undefined3 in_register_00000009;
  char *__s;
  string mulOrDiv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __s = "*";
  if (CONCAT31(in_register_00000009,divide) != 0) {
    __s = "/";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,__s,(allocator<char> *)&bStack_78);
  if (type - TYPE_BOOL < 4) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)baseExpr);
  }
  else {
    if (type - TYPE_INT < 4) {
      std::operator+(&local_58,"(",baseExpr);
      std::operator+(&bStack_78,&local_58,&local_38);
      std::operator+(__return_storage_ptr__,&bStack_78,"(i+1))");
    }
    else {
      std::operator+(&local_58,"(",baseExpr);
      std::operator+(&bStack_78,&local_58,&local_38);
      std::operator+(__return_storage_ptr__,&bStack_78,"float(i+1))");
    }
    std::__cxx11::string::~string((string *)&bStack_78);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string FunctionCase::incrementExpr (const string& baseExpr, glu::DataType type, bool divide)
{
	const string mulOrDiv = divide ? "/" : "*";

	return glu::isDataTypeBoolOrBVec(type)	? baseExpr
		 : glu::isDataTypeIntOrIVec(type)	? "(" + baseExpr + mulOrDiv + "(i+1))"
		 :									  "(" + baseExpr + mulOrDiv + "float(i+1))";
}